

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTypeHandler.cpp
# Opt level: O0

DynamicTypeHandler * __thiscall
Js::SimpleTypeHandler<3UL>::Clone(SimpleTypeHandler<3UL> *this,Recycler *recycler)

{
  Recycler *alloc;
  SimpleTypeHandler<3UL> *this_00;
  TrackAllocData local_40;
  Recycler *local_18;
  Recycler *recycler_local;
  SimpleTypeHandler<3UL> *this_local;
  
  local_18 = recycler;
  recycler_local = (Recycler *)this;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_40,(type_info *)&SimpleTypeHandler<3ul>::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleTypeHandler.cpp"
             ,0x4f);
  alloc = Memory::Recycler::TrackAllocInfo(recycler,&local_40);
  this_00 = (SimpleTypeHandler<3UL> *)new<Memory::Recycler>(0x50,alloc,0x43c4b0);
  SimpleTypeHandler(this_00,this);
  return &this_00->super_DynamicTypeHandler;
}

Assistant:

DynamicTypeHandler * SimpleTypeHandler<size>::Clone(Recycler * recycler)
    {
        return RecyclerNew(recycler, SimpleTypeHandler<size>, this);
    }